

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matlabfunctions.cpp
# Opt level: O0

double randn(RandnState *state)

{
  uint uVar1;
  int local_1c;
  uint local_18;
  int i;
  uint32_t tmp;
  uint32_t t;
  RandnState *state_local;
  
  uVar1 = state->g_randn_x ^ state->g_randn_x << 0xb;
  state->g_randn_x = state->g_randn_y;
  state->g_randn_y = state->g_randn_z;
  state->g_randn_z = state->g_randn_w;
  state->g_randn_w = state->g_randn_w ^ state->g_randn_w >> 0x13 ^ uVar1 ^ uVar1 >> 8;
  local_18 = state->g_randn_w >> 4;
  for (local_1c = 0; local_1c < 0xb; local_1c = local_1c + 1) {
    uVar1 = state->g_randn_x ^ state->g_randn_x << 0xb;
    state->g_randn_x = state->g_randn_y;
    state->g_randn_y = state->g_randn_z;
    state->g_randn_z = state->g_randn_w;
    state->g_randn_w = state->g_randn_w ^ state->g_randn_w >> 0x13 ^ uVar1 ^ uVar1 >> 8;
    local_18 = (state->g_randn_w >> 4) + local_18;
  }
  return (double)local_18 / 268435456.0 - 6.0;
}

Assistant:

double randn(RandnState *state) {
  uint32_t t;
  t = state->g_randn_x ^ (state->g_randn_x << 11);
  state->g_randn_x = state->g_randn_y;
  state->g_randn_y = state->g_randn_z;
  state->g_randn_z = state->g_randn_w;
  state->g_randn_w
    = (state->g_randn_w ^ (state->g_randn_w >> 19)) ^ (t ^ (t >> 8));

  uint32_t tmp = state->g_randn_w >> 4;
  for (int i = 0; i < 11; ++i) {
    t = state->g_randn_x ^ (state->g_randn_x << 11);
    state->g_randn_x = state->g_randn_y;
    state->g_randn_y = state->g_randn_z;
    state->g_randn_z = state->g_randn_w;
    state->g_randn_w
      = (state->g_randn_w ^ (state->g_randn_w >> 19)) ^ (t ^ (t >> 8));
    tmp += state->g_randn_w >> 4;
  }
  return tmp / 268435456.0 - 6.0;
}